

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O2

void cuddLocalCacheClearAll(DdManager *manager)

{
  DdLocalCache *pDVar1;
  DdLocalCache **ppDVar2;
  
  ppDVar2 = &manager->localCaches;
  while (pDVar1 = *ppDVar2, pDVar1 != (DdLocalCache *)0x0) {
    memset(pDVar1->item,0,(ulong)(pDVar1->itemsize * pDVar1->slots));
    ppDVar2 = &pDVar1->next;
  }
  return;
}

Assistant:

void
cuddLocalCacheClearAll(
  DdManager * manager)
{
    DdLocalCache *cache = manager->localCaches;

    while (cache != NULL) {
        memset(cache->item, 0, cache->slots * cache->itemsize);
        cache = cache->next;
    }
    return;

}